

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::Constant::GetVectorComponents
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,Constant *this,ConstantManager *const_mgr)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  long *plVar4;
  Constant *pCVar5;
  uint32_t i_1;
  uint uVar6;
  long lVar7;
  uint32_t i;
  ulong uVar8;
  Constant *element_null_const;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long *plVar2;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Constant[0x13])(this);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->type_->_vptr_Type[0xe])();
  lVar3 = CONCAT44(extraout_var_00,iVar1);
  if (lVar3 != 0) {
    if (plVar2 == (long *)0x0) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar5 = ConstantManager::GetConstant
                         (const_mgr,*(Type **)(lVar3 + 0x28),
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar5;
      for (uVar6 = 0; uVar6 < *(uint *)(lVar3 + 0x30); uVar6 = uVar6 + 1) {
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_48);
      }
    }
    else {
      lVar7 = 0;
      for (uVar8 = 0; uVar8 < *(uint *)(lVar3 + 0x30); uVar8 = uVar8 + 1) {
        plVar4 = (long *)(**(code **)(*plVar2 + 0xc0))(plVar2);
        std::
        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ::push_back(__return_storage_ptr__,(value_type *)(*plVar4 + lVar7));
        lVar7 = lVar7 + 8;
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("vector_type != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x22b,
                "std::vector<const analysis::Constant *> spvtools::opt::analysis::Constant::GetVectorComponents(analysis::ConstantManager *) const"
               );
}

Assistant:

std::vector<const analysis::Constant*> Constant::GetVectorComponents(
    analysis::ConstantManager* const_mgr) const {
  std::vector<const analysis::Constant*> components;
  const analysis::VectorConstant* a = this->AsVectorConstant();
  const analysis::Vector* vector_type = this->type()->AsVector();
  assert(vector_type != nullptr);
  if (a != nullptr) {
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(a->GetComponents()[i]);
    }
  } else {
    const analysis::Type* element_type = vector_type->element_type();
    const analysis::Constant* element_null_const =
        const_mgr->GetConstant(element_type, {});
    for (uint32_t i = 0; i < vector_type->element_count(); ++i) {
      components.push_back(element_null_const);
    }
  }
  return components;
}